

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepImage.cpp
# Opt level: O2

void anon_unknown.dwarf_188c2::testSetSampleCounts(Box2i *dataWindow)

{
  float *pfVar1;
  float fVar2;
  uint uVar3;
  float **ppfVar4;
  double dVar5;
  Box2i *pBVar6;
  ostream *poVar7;
  DeepImageLevel *this;
  TypedDeepImageChannel<float> *pTVar8;
  long lVar9;
  long lVar10;
  uint *puVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  uint newNumSamples;
  int iVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  Rand48 random;
  allocator<char> local_101;
  SampleCountChannel *local_100;
  Box2i *local_f8;
  ulong local_f0;
  float oldSamples [20];
  DeepImage img;
  
  poVar7 = std::operator<<((ostream *)&std::cout,"change sample counts, data window = (");
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,(dataWindow->min).x);
  poVar7 = std::operator<<(poVar7,", ");
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,(dataWindow->min).y);
  poVar7 = std::operator<<(poVar7,") - (");
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,(dataWindow->max).x);
  poVar7 = std::operator<<(poVar7,", ");
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,(dataWindow->max).y);
  poVar7 = std::operator<<(poVar7,")");
  std::endl<char,std::char_traits<char>>(poVar7);
  Imf_2_5::DeepImage::DeepImage((DeepImage *)&img.super_Image);
  Imf_2_5::Image::resize(&img.super_Image,dataWindow,ONE_LEVEL,ROUND_DOWN);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)oldSamples,"F",(allocator<char> *)&random);
  Imf_2_5::Image::insertChannel(&img.super_Image,(string *)oldSamples,FLOAT,1,1,false);
  std::__cxx11::string::~string((string *)oldSamples);
  random._state[0] = 0x5a5a;
  random._state[1] = 0x5a5a;
  random._state[2] = 0x5a5a;
  this = Imf_2_5::DeepImage::level(&img,0);
  std::__cxx11::string::string<std::allocator<char>>((string *)oldSamples,"F",&local_101);
  pTVar8 = Imf_2_5::DeepImageLevel::typedChannel<float>(this,(string *)oldSamples);
  std::__cxx11::string::~string((string *)oldSamples);
  local_100 = &this->_sampleCounts;
  uVar13 = 0;
  local_f8 = dataWindow;
  do {
    pBVar6 = local_f8;
    if ((pTVar8->super_DeepImageChannel).super_ImageChannel._numPixels <= uVar13) {
      Imf_2_5::DeepImage::~DeepImage(&img);
      return;
    }
    iVar15 = (local_f8->min).x;
    local_f0 = uVar13;
    lVar9 = Imath_2_5::nrand48(random._state);
    iVar12 = (pTVar8->super_DeepImageChannel).super_ImageChannel._pixelsPerRow;
    iVar17 = (pBVar6->min).y;
    lVar10 = Imath_2_5::nrand48(random._state);
    iVar15 = iVar15 + (int)(lVar9 % (long)iVar12);
    iVar17 = iVar17 + (int)(lVar10 % (long)(pTVar8->super_DeepImageChannel).super_ImageChannel.
                                           _pixelsPerColumn);
    puVar11 = Imf_2_5::SampleCountChannel::at(local_100,iVar15,iVar17);
    uVar3 = *puVar11;
    uVar18 = (ulong)(int)uVar3;
    lVar9 = Imath_2_5::nrand48(random._state);
    uVar13 = lVar9 % 0x15;
    ppfVar4 = pTVar8->_base;
    iVar12 = (pTVar8->super_DeepImageChannel).super_ImageChannel._pixelsPerRow;
    uVar16 = 0;
    if (0 < (int)uVar3) {
      uVar16 = (ulong)uVar3;
    }
    for (uVar14 = 0; uVar16 != uVar14; uVar14 = uVar14 + 1) {
      oldSamples[uVar14] = ppfVar4[iVar12 * iVar17 + iVar15][uVar14];
    }
    newNumSamples = (uint)uVar13;
    Imf_2_5::SampleCountChannel::set(local_100,iVar15,iVar17,newNumSamples);
    iVar12 = (pTVar8->super_DeepImageChannel).super_ImageChannel._pixelsPerRow * iVar17 + iVar15;
    if ((int)uVar3 < (int)newNumSamples) {
      uVar14 = 0;
      while (uVar16 != uVar14) {
        fVar2 = pTVar8->_base[iVar12][uVar14];
        pfVar1 = oldSamples + uVar14;
        uVar14 = uVar14 + 1;
        if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
          __assert_fail("channel(x, y)[j] == oldSamples[j]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfUtilTest/testDeepImage.cpp"
                        ,0x1e9,"void (anonymous namespace)::testSetSampleCounts(const Box2i &)");
        }
      }
      for (; uVar13 != uVar18; uVar18 = uVar18 + 1) {
        if ((pTVar8->_base
             [(pTVar8->super_DeepImageChannel).super_ImageChannel._pixelsPerRow * iVar17 + iVar15]
             [uVar18] != 0.0) ||
           (NAN(pTVar8->_base
                [(pTVar8->super_DeepImageChannel).super_ImageChannel._pixelsPerRow * iVar17 + iVar15
                ][uVar18]))) {
          __assert_fail("channel(x, y)[j] == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfUtilTest/testDeepImage.cpp"
                        ,0x1ed,"void (anonymous namespace)::testSetSampleCounts(const Box2i &)");
        }
        dVar5 = (double)Imath_2_5::erand48(random._state);
        pTVar8->_base
        [(pTVar8->super_DeepImageChannel).super_ImageChannel._pixelsPerRow * iVar17 + iVar15]
        [uVar18] = (float)dVar5;
      }
    }
    else {
      uVar16 = 0;
      if (0 < (int)newNumSamples) {
        uVar16 = uVar13 & 0xffffffff;
      }
      uVar13 = 0;
      while (uVar16 != uVar13) {
        fVar2 = pTVar8->_base[iVar12][uVar13];
        pfVar1 = oldSamples + uVar13;
        uVar13 = uVar13 + 1;
        if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
          __assert_fail("channel(x, y)[j] == oldSamples[j]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfUtilTest/testDeepImage.cpp"
                        ,500,"void (anonymous namespace)::testSetSampleCounts(const Box2i &)");
        }
      }
    }
    uVar13 = local_f0 + 1;
  } while( true );
}

Assistant:

void
testSetSampleCounts (const Box2i &dataWindow)
{
    cout << "change sample counts, data window = "
            "(" << dataWindow.min.x << ", " << dataWindow.min.y << ") - "
            "(" << dataWindow.max.x << ", " << dataWindow.max.y << ")" << endl;

    DeepImage img;
    img.resize (dataWindow, ONE_LEVEL, ROUND_DOWN);
    img.insertChannel ("F", FLOAT, 1, 1, false);

    Rand48 random (0);

    DeepImageLevel &level = img.level();
    DeepFloatChannel &channel = level.typedChannel <float> ("F");
    SampleCountChannel &sampleCounts = level.sampleCounts();

    const int MAX_SAMPLES = 20;

    for (size_t i = 0; i < channel.numPixels(); ++i)
    {
        int x = dataWindow.min.x + random.nexti() % channel.pixelsPerRow();
        int y = dataWindow.min.y + random.nexti() % channel.pixelsPerColumn();

        int oldN = sampleCounts.at (x, y);
        int newN = random.nexti() % (MAX_SAMPLES + 1);

        float oldSamples[MAX_SAMPLES];
        
        for (int j = 0; j < oldN; ++j)
            oldSamples[j] = channel(x, y)[j];

        sampleCounts.set (x, y, newN);

        if (newN > oldN)
        {
            for (int j = 0; j < oldN; ++j)
                assert (channel(x, y)[j] == oldSamples[j]);

            for (int j = oldN; j < newN; ++j)
            {
                assert (channel(x, y)[j] == 0);
                channel(x, y)[j] = random.nextf();
            }
        }
        else
        {
            for (int j = 0; j < newN; ++j)
                assert (channel(x, y)[j] == oldSamples[j]);
        }
    }
}